

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O0

cmValue cmTargetPropertyComputer::GetLocation<cmTarget>(cmTarget *tgt,string *prop,cmMakefile *mf)

{
  __type _Var1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  string *psVar7;
  string_view sVar8;
  allocator local_b1;
  undefined1 local_b0 [8];
  string configName_1;
  undefined1 local_70 [8];
  string configName;
  allocator<char> local_29;
  cmMakefile *local_28;
  cmMakefile *mf_local;
  string *prop_local;
  cmTarget *tgt_local;
  
  local_28 = mf;
  mf_local = (cmMakefile *)prop;
  prop_local = (string *)tgt;
  TVar3 = cmTarget::GetType(tgt);
  if ((((TVar3 != EXECUTABLE) &&
       (TVar3 = cmTarget::GetType((cmTarget *)prop_local), TVar3 != STATIC_LIBRARY)) &&
      (TVar3 = cmTarget::GetType((cmTarget *)prop_local), TVar3 != SHARED_LIBRARY)) &&
     ((TVar3 = cmTarget::GetType((cmTarget *)prop_local), TVar3 != MODULE_LIBRARY &&
      (TVar3 = cmTarget::GetType((cmTarget *)prop_local), TVar3 != UNKNOWN_LIBRARY))))
  goto LAB_002d9e7f;
  if ((GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)::
       propLOCATION_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                                   ::propLOCATION_abi_cxx11_), iVar4 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                ::propLOCATION_abi_cxx11_,"LOCATION",&local_29);
    std::allocator<char>::~allocator(&local_29);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                  ::propLOCATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                         ::propLOCATION_abi_cxx11_);
  }
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          mf_local,&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                                    ::propLOCATION_abi_cxx11_);
  if (_Var1) {
    bVar2 = cmTarget::IsImported((cmTarget *)prop_local);
    if (!bVar2) {
      psVar7 = cmTarget::GetName_abi_cxx11_((cmTarget *)prop_local);
      bVar2 = HandleLocationPropertyPolicy(psVar7,local_28);
      if (!bVar2) {
        cmValue::cmValue((cmValue *)&tgt_local,(nullptr_t)0x0);
        return (cmValue)(string *)tgt_local;
      }
    }
    psVar7 = ComputeLocationForBuild<cmTarget>((cmTarget *)prop_local);
    cmValue::cmValue((cmValue *)&tgt_local,psVar7);
    return (cmValue)(string *)tgt_local;
  }
  sVar8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)mf_local);
  configName.field_2._8_8_ = sVar8._M_len;
  bVar2 = cmHasLiteralPrefix<10ul>(sVar8,(char (*) [10])"LOCATION_");
  if (bVar2) {
    bVar2 = cmTarget::IsImported((cmTarget *)prop_local);
    if (!bVar2) {
      psVar7 = cmTarget::GetName_abi_cxx11_((cmTarget *)prop_local);
      bVar2 = HandleLocationPropertyPolicy(psVar7,local_28);
      if (!bVar2) {
        cmValue::cmValue((cmValue *)&tgt_local,(nullptr_t)0x0);
        return (cmValue)(string *)tgt_local;
      }
    }
    std::__cxx11::string::substr((ulong)local_70,(ulong)mf_local);
    psVar7 = ComputeLocation<cmTarget>((cmTarget *)prop_local,(string *)local_70);
    cmValue::cmValue((cmValue *)&tgt_local,psVar7);
    std::__cxx11::string::~string((string *)local_70);
    return (cmValue)(string *)tgt_local;
  }
  sVar8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)mf_local);
  bVar2 = cmHasLiteralSuffix<10ul>(sVar8,(char (*) [10])0xdb3e24);
  if (!bVar2) goto LAB_002d9e7f;
  sVar8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)mf_local);
  configName_1.field_2._8_8_ = sVar8._M_len;
  bVar2 = cmHasLiteralPrefix<17ul>(sVar8,(char (*) [17])"XCODE_ATTRIBUTE_");
  if (bVar2) goto LAB_002d9e7f;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  lVar6 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,pcVar5,lVar6 - 9,&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b0,"IMPORTED");
  if (bVar2) {
    bVar2 = cmTarget::IsImported((cmTarget *)prop_local);
    if (!bVar2) {
      psVar7 = cmTarget::GetName_abi_cxx11_((cmTarget *)prop_local);
      bVar2 = HandleLocationPropertyPolicy(psVar7,local_28);
      if (!bVar2) {
        cmValue::cmValue((cmValue *)&tgt_local,(nullptr_t)0x0);
        bVar2 = true;
        goto LAB_002d9e61;
      }
    }
    psVar7 = ComputeLocation<cmTarget>((cmTarget *)prop_local,(string *)local_b0);
    cmValue::cmValue((cmValue *)&tgt_local,psVar7);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
LAB_002d9e61:
  std::__cxx11::string::~string((string *)local_b0);
  if (bVar2) {
    return (cmValue)(string *)tgt_local;
  }
LAB_002d9e7f:
  cmValue::cmValue((cmValue *)&tgt_local,(nullptr_t)0x0);
  return (cmValue)(string *)tgt_local;
}

Assistant:

static cmValue GetLocation(Target const* tgt, std::string const& prop,
                             cmMakefile const& mf)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
          return nullptr;
        }
        return cmValue(ComputeLocationForBuild(tgt));
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
          return nullptr;
        }
        std::string configName = prop.substr(9);
        return cmValue(ComputeLocation(tgt, configName));
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
            return nullptr;
          }
          return cmValue(ComputeLocation(tgt, configName));
        }
      }
    }
    return nullptr;
  }